

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O2

Error __thiscall asmjit::Logger::logBinary(Logger *this,void *data,size_t size)

{
  Error extraout_EAX;
  __off_t extraout_RDX;
  __off_t __length;
  __off_t extraout_RDX_00;
  Error EVar1;
  size_t size_00;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  StringTmp<256UL> sb;
  
  sb.super_String.field_0._large.data = sb._embeddedData;
  sb.super_String.field_0._large.size = 0;
  sb.super_String.field_0._0_8_ = 0x20;
  sb.super_String.field_0._large.capacity = 0x107;
  sb._embeddedData[0] = '\0';
  String::append(&sb.super_String,"db ",3);
  __length = extraout_RDX;
  for (; size != 0; size = size - size_00) {
    size_00 = 0x10;
    if (size < 0x10) {
      size_00 = size;
    }
    String::truncate(&sb.super_String,(char *)0x3,__length);
    String::appendHex(&sb.super_String,data,size_00,'\0');
    String::append(&sb.super_String,'\n');
    log(this,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    EVar1 = extraout_EAX;
    if (extraout_EAX != 0) goto LAB_0011760e;
    data = (void *)((long)data + size_00);
    __length = extraout_RDX_00;
  }
  EVar1 = 0;
LAB_0011760e:
  String::reset(&sb.super_String);
  return EVar1;
}

Assistant:

Error Logger::logBinary(const void* data, size_t size) noexcept {
  static const char prefix[] = "db ";

  StringTmp<256> sb;
  sb.append(prefix, ASMJIT_ARRAY_SIZE(prefix) - 1);

  size_t i = size;
  const uint8_t* s = static_cast<const uint8_t*>(data);

  while (i) {
    uint32_t n = uint32_t(Support::min<size_t>(i, 16));
    sb.truncate(ASMJIT_ARRAY_SIZE(prefix) - 1);
    sb.appendHex(s, n);
    sb.append('\n');
    ASMJIT_PROPAGATE(log(sb));
    s += n;
    i -= n;
  }

  return kErrorOk;
}